

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall BanMan::DumpBanlist(BanMan *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  Level level;
  BanMan *pBVar6;
  unique_lock<std::mutex> *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  long local_78;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  banmap_t banmap;
  banmap_t *banSet;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (DumpBanlist()::dump_mutex == '\0') {
    iVar3 = __cxa_guard_acquire(&DumpBanlist()::dump_mutex);
    if (iVar3 != 0) {
      __cxa_guard_release(&DumpBanlist()::dump_mutex);
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock1,&DumpBanlist::dump_mutex,"dump_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
             ,0x33,false);
  banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &banmap._M_t._M_impl.super__Rb_tree_header._M_header;
  banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  banmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock2,&this->m_banned_mutex,"m_banned_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
             ,0x37,false);
  SweepBanned(this);
  if (this->m_is_dirty == false) {
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  }
  else {
    std::
    _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
    ::operator=(&banmap._M_t,&(this->m_banned)._M_t);
    this->m_is_dirty = false;
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    lVar4 = std::chrono::_V2::steady_clock::now();
    this_00 = (unique_lock<std::mutex> *)&this->m_ban_db;
    banSet = &banmap;
    bVar2 = CBanDB::Write((CBanDB *)this_00,banSet);
    level = (Level)banSet;
    if (!bVar2) {
      pBVar6 = this;
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                (&criticalblock2,&this->m_banned_mutex,"m_banned_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
                 ,0x40,false);
      level = (Level)pBVar6;
      this->m_is_dirty = true;
      this_00 = &criticalblock2.super_unique_lock;
      std::unique_lock<std::mutex>::~unique_lock(this_00);
    }
    bVar2 = ::LogAcceptCategory((LogFlags)this_00,level);
    if (bVar2) {
      criticalblock2.super_unique_lock._M_device =
           (mutex_type *)banmap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      lVar5 = std::chrono::_V2::steady_clock::now();
      local_78 = (lVar5 - lVar4) / 1000000;
      logging_function._M_str = "DumpBanlist";
      logging_function._M_len = 0xb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
      ;
      source_file._M_len = 0x5a;
      LogPrintFormatInternal<unsigned_long,long>
                (logging_function,source_file,0x45,NET,Debug,(ConstevalFormatString<2U>)0x6cb7b6,
                 (unsigned_long *)&criticalblock2.super_unique_lock,&local_78);
    }
  }
  std::
  _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::~_Rb_tree(&banmap._M_t);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::DumpBanlist()
{
    static Mutex dump_mutex;
    LOCK(dump_mutex);

    banmap_t banmap;
    {
        LOCK(m_banned_mutex);
        SweepBanned();
        if (!m_is_dirty) return;
        banmap = m_banned;
        m_is_dirty = false;
    }

    const auto start{SteadyClock::now()};
    if (!m_ban_db.Write(banmap)) {
        LOCK(m_banned_mutex);
        m_is_dirty = true;
    }

    LogDebug(BCLog::NET, "Flushed %d banned node addresses/subnets to disk  %dms\n", banmap.size(),
             Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}